

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonTests.cc
# Opt level: O1

void avro::json::testString(TestData<const_char_*> *d)

{
  element_type *peVar1;
  int iVar2;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar3;
  Entity n;
  any local_d8;
  char **local_d0;
  element_type *local_c8;
  assertion_result local_c0;
  undefined1 local_a4 [12];
  undefined1 local_98;
  undefined8 *local_90;
  char *local_88;
  undefined **local_80;
  undefined1 local_78;
  undefined8 *local_70;
  element_type **local_68;
  undefined **local_60;
  undefined1 local_58;
  undefined8 *local_50;
  char ***local_48;
  const_string local_40;
  
  avro::json::loadEntity((char *)&n);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1c39f0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a23dd);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x5f;
  local_98 = 0;
  local_a4._4_8_ = &PTR__lazy_ostream_001c0950;
  local_90 = &boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  local_c8 = (element_type *)local_a4;
  local_a4._0_4_ = _n;
  local_d0 = (char **)&d->type;
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(_n == d->type);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_40.m_end = "";
  local_68 = &local_c8;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_001c0990;
  local_70 = &boost::unit_test::lazy_ostream::inst;
  local_48 = &local_d0;
  local_58 = 0;
  local_60 = &PTR__lazy_ostream_001c0990;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,(lazy_ostream *)(local_a4 + 4),&local_40,0x5f,CHECK,CHECK_EQUAL,2,"n.type()",
             &local_80,"d.type",&local_60);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1c39f0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1a23dd);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x60;
  local_98 = 0;
  local_a4._4_8_ = &PTR__lazy_ostream_001c0950;
  local_90 = &boost::unit_test::lazy_ostream::inst;
  local_88 = "";
  avro::json::Entity::ensureType((EntityType)&n);
  psVar3 = boost::any_cast<boost::shared_ptr<std::__cxx11::string>>(&local_d8);
  peVar1 = psVar3->px;
  iVar2 = std::__cxx11::string::compare((char *)peVar1);
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
  ;
  local_40.m_end = "";
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_001bff38;
  local_70 = &boost::unit_test::lazy_ostream::inst;
  local_68 = &local_c8;
  local_58 = 0;
  local_60 = &PTR__lazy_ostream_001c0a90;
  local_50 = &boost::unit_test::lazy_ostream::inst;
  local_48 = &local_d0;
  local_d0 = &d->value;
  local_c8 = peVar1;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,(lazy_ostream *)(local_a4 + 4),&local_40,0x60,CHECK,CHECK_EQUAL,2,
             "n.stringValue()",&local_80,"d.value",&local_60);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  if (local_d8.content != (placeholder *)0x0) {
    (**(code **)(*(long *)local_d8.content + 8))();
  }
  return;
}

Assistant:

void testString(const TestData<const char*>& d)
{
    Entity n = loadEntity(d.input);
    BOOST_CHECK_EQUAL(n.type(), d.type);
    BOOST_CHECK_EQUAL(n.stringValue(), d.value);
}